

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O0

void jpc_pi_destroy(jpc_pi_t *pi)

{
  uint local_1c;
  jpc_picomp_t *pjStack_18;
  uint compno;
  jpc_picomp_t *picomp;
  jpc_pi_t *pi_local;
  
  if (pi->picomps != (jpc_picomp_t *)0x0) {
    local_1c = 0;
    pjStack_18 = pi->picomps;
    for (; local_1c < pi->numcomps; local_1c = local_1c + 1) {
      jpc_picomp_destroy(pjStack_18);
      pjStack_18 = pjStack_18 + 1;
    }
    jas_free(pi->picomps);
  }
  if (pi->pchglist != (jpc_pchglist_t *)0x0) {
    jpc_pchglist_destroy(pi->pchglist);
  }
  jas_free(pi);
  return;
}

Assistant:

void jpc_pi_destroy(jpc_pi_t *pi)
{
	jpc_picomp_t *picomp;
	unsigned compno;
	if (pi->picomps) {
		for (compno = 0, picomp = pi->picomps; compno < pi->numcomps;
		  ++compno, ++picomp) {
			jpc_picomp_destroy(picomp);
		}
		jas_free(pi->picomps);
	}
	if (pi->pchglist) {
		jpc_pchglist_destroy(pi->pchglist);
	}
	jas_free(pi);
}